

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  i64 iVar2;
  char *__s;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  double r;
  double local_28;
  
  uVar5 = 0;
  if (argc == 2) {
    pMVar1 = argv[1];
    uVar5._0_2_ = pMVar1->flags;
    uVar5._2_1_ = pMVar1->enc;
    uVar5._3_1_ = pMVar1->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      return;
    }
    iVar2 = sqlite3VdbeIntValue(pMVar1);
    uVar4 = 0x1e;
    if ((int)(uint)iVar2 < 0x1e) {
      uVar4 = (uint)iVar2;
    }
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
  }
  pMVar1 = *argv;
  uVar4._0_2_ = pMVar1->flags;
  uVar4._2_1_ = pMVar1->enc;
  uVar4._3_1_ = pMVar1->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
    return;
  }
  local_28 = sqlite3VdbeRealValue(pMVar1);
  if (ABS(local_28) <= 4503599627370496.0) {
    if (uVar5 == 0) {
      local_28 = (double)(long)(local_28 + *(double *)(&DAT_001e4f90 + (ulong)(local_28 < 0.0) * 8))
      ;
    }
    else {
      __s = sqlite3_mprintf("%.*f",(ulong)uVar5);
      if (__s == (char *)0x0) {
        sqlite3_result_error_nomem(context);
        return;
      }
      sVar3 = strlen(__s);
      sqlite3AtoF(__s,&local_28,(uint)sVar3 & 0x3fffffff,'\x01');
      sqlite3_free(__s);
    }
  }
  sqlite3VdbeMemSetDouble(context->pOut,local_28);
  return;
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  int n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( r<-4503599627370496.0 || r>+4503599627370496.0 ){
    /* The value has no fractional part so there is nothing to round */
  }else if( n==0 ){
    r = (double)((sqlite_int64)(r+(r<0?-0.5:+0.5)));
  }else{
    zBuf = sqlite3_mprintf("%.*f",n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}